

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O0

bool __thiscall hwtest::pgraph::MthdCelsiusConfig::is_valid_val(MthdCelsiusConfig *this)

{
  MthdCelsiusConfig *this_local;
  
  if (((this->super_SingleMthdTest).super_MthdTest.val & 0xceeeeefe) == 0) {
    if ((((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x22) >> 0x3e == 0) ||
       ((this->super_SingleMthdTest).super_MthdTest.cls == 0x99)) {
      if (((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x37) < 0) &&
         (-1 < (long)((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x2f))) {
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool is_valid_val() override {
		if (val & 0xceeeeefe)
			return false;
		if (extr(val, 28, 2) && cls != 0x99)
			return false;
		if (extr(val, 8, 1) && !extr(val, 16, 1))
			return false;
		return true;
	}